

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3phseg_io.c
# Opt level: O0

int s3phseg_write(char *fn,acmod_set_t *acmod_set,s3phseg_t *phseg)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  FILE *fp;
  s3phseg_t *phseg_local;
  acmod_set_t *acmod_set_local;
  char *fn_local;
  
  __stream = fopen(fn,"w");
  if (__stream == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    fprintf(__stream,"\t%5s %5s %9s %s\n","SFrm","EFrm","SegAScr","Phone");
    for (fp = (FILE *)phseg; fp != (FILE *)0x0; fp = (FILE *)fp->_IO_read_base) {
      uVar1 = *(uint *)&fp->field_0x4;
      uVar2 = *(uint *)&fp->_IO_read_ptr;
      uVar3 = *(uint *)((long)&fp->_IO_read_ptr + 4);
      pcVar4 = acmod_set_id2name(acmod_set,fp->_flags);
      fprintf(__stream,"\t%5d %5d %9d %s\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,pcVar4);
    }
    fclose(__stream);
    fn_local._4_4_ = 0;
  }
  return fn_local._4_4_;
}

Assistant:

int
s3phseg_write(const char *fn,
	      acmod_set_t *acmod_set,
	      s3phseg_t *phseg)
{
	FILE *fp;

	if ((fp = fopen(fn, "w")) == NULL)
		return S3_ERROR;

	fprintf (fp, "\t%5s %5s %9s %s\n",
		 "SFrm", "EFrm", "SegAScr", "Phone");
	for (; phseg; phseg = phseg->next) {
		fprintf(fp, "\t%5d %5d %9d %s\n",
			phseg->sf, phseg->ef, phseg->score,
			acmod_set_id2name(acmod_set, phseg->phone));
	}
	fclose (fp);

	return S3_SUCCESS;
}